

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::BufferGLImpl::BufferGLImpl
          (BufferGLImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *BuffViewObjMemAllocator,RenderDeviceGLImpl *pDeviceGL,
          BufferDesc *BuffDesc,GLContextState *CtxState,GLuint GLHandle,bool bIsDeviceInternal)

{
  GLenum GVar1;
  char (*Args_1) [15];
  GLint BufferSize;
  GLenum BindTarget;
  GLenum err_1;
  string msg;
  char (*in_stack_ffffffffffffff38) [2];
  uint local_a4;
  GLenum local_a0;
  uint local_9c;
  undefined1 local_98 [32];
  Uint64 local_78;
  IReferenceCounters *local_70;
  FixedBlockMemoryAllocator *local_68;
  RenderDeviceGLImpl *local_60;
  BufferDesc local_58;
  
  local_58.ImmediateContextMask = BuffDesc->ImmediateContextMask;
  local_58.super_DeviceObjectAttribs.Name = (BuffDesc->super_DeviceObjectAttribs).Name;
  local_58.Size = BuffDesc->Size;
  local_58.BindFlags = BuffDesc->BindFlags;
  local_58.Usage = BuffDesc->Usage;
  local_58.CPUAccessFlags = BuffDesc->CPUAccessFlags;
  local_58.Mode = BuffDesc->Mode;
  local_58.MiscFlags = BuffDesc->MiscFlags;
  local_58.ElementByteStride = BuffDesc->ElementByteStride;
  local_58._28_4_ = *(undefined4 *)&BuffDesc->field_0x1c;
  local_70 = pRefCounters;
  local_68 = BuffViewObjMemAllocator;
  local_60 = pDeviceGL;
  local_a0 = GetBufferBindTarget(&local_58);
  local_98._0_8_ = (Char *)0x0;
  local_98._8_8_ = (ulong)(uint)local_98._12_4_ << 0x20;
  Args_1 = (char (*) [15])0x1;
  GLContextState::BindBuffer(CtxState,local_a0,(GLBufferObj *)local_98,true);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)local_98);
  (*__glewBindBuffer)(local_a0,GLHandle);
  local_a4 = glGetError();
  if (local_a4 != 0) {
    in_stack_ffffffffffffff38 = (char (*) [2])0x3402b3;
    LogError<false,char[29],unsigned_int,char[8],char[17],unsigned_int>
              (false,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xa8,(char (*) [29])"Failed to bind GL buffer to ",&local_a0,(char (*) [8])0x3402b3,
               (char (*) [17])"\nGL Error Code: ",&local_a4);
    FormatString<char[6]>((string *)local_98,(char (*) [6])0x32952e);
    Args_1 = (char (*) [15])0xa8;
    DebugAssertionFailed
              ((Char *)local_98._0_8_,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xa8);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  local_a4 = 0;
  (*__glewGetBufferParameteriv)(local_a0,0x8764,(GLint *)&local_a4);
  local_9c = glGetError();
  if (local_9c != 0) {
    in_stack_ffffffffffffff38 = (char (*) [2])&local_9c;
    LogError<false,char[32],char[17],unsigned_int>
              (false,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xac,(char (*) [32])"glGetBufferParameteriv() failed",
               (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff38);
    FormatString<char[6]>((string *)local_98,(char (*) [6])0x32952e);
    Args_1 = (char (*) [15])0xac;
    DebugAssertionFailed
              ((Char *)local_98._0_8_,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xac);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  if ((int)local_a4 < 1) {
    FormatString<char[26],char[15]>
              ((string *)local_98,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BufferSize > 0",Args_1);
    DebugAssertionFailed
              ((Char *)local_98._0_8_,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xad);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  if ((local_58.Size != 0) && (local_58.Size != local_a4)) {
    FormatString<char[42],unsigned_long,char[60],int,char[2]>
              ((string *)local_98,(Diligent *)"Buffer size specified by the BufferDesc (",
               (char (*) [42])&local_58.Size,
               (unsigned_long *)") does not match the size recovered from gl buffer object (",
               (char (*) [60])&local_a4,(int *)0x33e49a,in_stack_ffffffffffffff38);
    DebugAssertionFailed
              ((Char *)local_98._0_8_,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xaf);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  if (0 < (long)(int)local_a4) {
    local_58.Size = (long)(int)local_a4;
  }
  (*__glewBindBuffer)(local_a0,0);
  local_9c = glGetError();
  if (local_9c != 0) {
    LogError<false,char[27],char[17],unsigned_int>
              (false,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xb4,(char (*) [27])"Failed to unbind GL buffer",(char (*) [17])"\nGL Error Code: ",
               &local_9c);
    FormatString<char[6]>((string *)local_98,(char (*) [6])0x32952e);
    DebugAssertionFailed
              ((Char *)local_98._0_8_,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xb4);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  local_98._0_8_ = local_58.super_DeviceObjectAttribs.Name;
  local_98._8_8_ = local_58.Size;
  local_98._16_4_ = local_58.BindFlags;
  local_98[0x14] = local_58.Usage;
  local_98[0x15] = local_58.CPUAccessFlags;
  local_98[0x16] = local_58.Mode;
  local_98[0x17] = local_58.MiscFlags;
  local_98._24_8_ = local_58._24_8_;
  local_78 = local_58.ImmediateContextMask;
  BufferBase<Diligent::EngineGLImplTraits>::BufferBase
            (&this->super_BufferBase<Diligent::EngineGLImplTraits>,local_70,local_68,local_60,
             (BufferDesc *)local_98,bIsDeviceInternal);
  (this->super_AsyncWritableResource).m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (this->super_BufferBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>.
  super_ObjectBase<Diligent::IBufferGL>.super_RefCountedObject<Diligent::IBufferGL>.super_IBufferGL.
  super_IBuffer.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_0041f520;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlBuffer,true,(GLBufferObjCreateReleaseHelper)GLHandle);
  GVar1 = GetBufferBindTarget(&(this->super_BufferBase<Diligent::EngineGLImplTraits>).
                               super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                               .m_Desc);
  this->m_BindTarget = GVar1;
  GVar1 = UsageToGLUsage(BuffDesc);
  this->m_GLUsageHint = GVar1;
  (this->super_BufferBase<Diligent::EngineGLImplTraits>).m_MemoryProperties =
       MEMORY_PROPERTY_HOST_COHERENT;
  return;
}

Assistant:

BufferGLImpl::BufferGLImpl(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& BuffViewObjMemAllocator,
                           RenderDeviceGLImpl*        pDeviceGL,
                           const BufferDesc&          BuffDesc,
                           GLContextState&            CtxState,
                           GLuint                     GLHandle,
                           bool                       bIsDeviceInternal) :
    // clang-format off
    TBufferBase
    {
        pRefCounters,
        BuffViewObjMemAllocator,
        pDeviceGL,
        GetBufferDescFromGLHandle(CtxState, BuffDesc, GLHandle),
        bIsDeviceInternal
    },
    // Attach to external buffer handle
    m_GlBuffer    {true, GLObjectWrappers::GLBufferObjCreateReleaseHelper(GLHandle)},
    m_BindTarget  {GetBufferBindTarget(m_Desc)},
    m_GLUsageHint {UsageToGLUsage(BuffDesc)   }
// clang-format on
{
    m_MemoryProperties = MEMORY_PROPERTY_HOST_COHERENT;
}